

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

void __thiscall mat<4UL,_3UL>::set_col(mat<4UL,_3UL> *this,size_t idx,vec<4UL,_double> *v)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  
  if (2 < idx) {
    __assert_fail("idx >= 0 && idx < ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                  ,0xbe,
                  "void mat<4, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 4, ncols = 3]"
                 );
  }
  lVar2 = (ulong)(idx != 1) * 8 + 8;
  if (idx == 0) {
    lVar2 = 0;
  }
  pdVar1 = (double *)((long)&this->rows[3].x + lVar2);
  lVar2 = 3;
  do {
    if (2 < idx) {
      __assert_fail("i >= 0 && i < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                    ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
    }
    *pdVar1 = v->data[lVar2];
    pdVar1 = pdVar1 + -3;
    bVar3 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar3);
  return;
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }